

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btShapeHull.cpp
# Opt level: O3

void __thiscall btShapeHull::~btShapeHull(btShapeHull *this)

{
  uint *ptr;
  btVector3 *ptr_00;
  
  ptr = (this->m_indices).m_data;
  if ((ptr != (uint *)0x0) && ((this->m_indices).m_ownsMemory == true)) {
    btAlignedFreeInternal(ptr);
  }
  (this->m_indices).m_ownsMemory = true;
  (this->m_indices).m_data = (uint *)0x0;
  (this->m_indices).m_size = 0;
  (this->m_indices).m_capacity = 0;
  ptr_00 = (this->m_vertices).m_data;
  if ((ptr_00 != (btVector3 *)0x0) && ((this->m_vertices).m_ownsMemory == true)) {
    btAlignedFreeInternal(ptr_00);
  }
  (this->m_vertices).m_ownsMemory = true;
  (this->m_vertices).m_data = (btVector3 *)0x0;
  (this->m_vertices).m_size = 0;
  (this->m_vertices).m_capacity = 0;
  btAlignedObjectArray<unsigned_int>::~btAlignedObjectArray(&this->m_indices);
  btAlignedObjectArray<btVector3>::~btAlignedObjectArray(&this->m_vertices);
  return;
}

Assistant:

btShapeHull::~btShapeHull ()
{
	m_indices.clear();	
	m_vertices.clear ();
}